

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCallIndirectExpr
          (ExprVisitorDelegate *this,CallIndirectExpr *expr)

{
  WatWriter *pWVar1;
  char *local_50;
  
  pWVar1 = this->writer_;
  Opcode::GetInfo((Opcode *)&Opcode::CallIndirect_Opcode);
  WritePuts(pWVar1,local_50,Space);
  if (((expr->table).type_ != Index) || ((expr->table).field_2.index_ != 0)) {
    WriteVar(this->writer_,&expr->table,Space);
  }
  pWVar1 = this->writer_;
  WritePuts(pWVar1,"(",None);
  WritePuts(pWVar1,"type",Space);
  pWVar1->indent_ = pWVar1->indent_ + 2;
  WriteVar(this->writer_,&(expr->decl).type_var,Newline);
  WriteClose(this->writer_,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCallIndirectExpr(
    CallIndirectExpr* expr) {
  writer_->WritePutsSpace(Opcode::CallIndirect_Opcode.GetName());
  if (!expr->table.is_index() || expr->table.index() != 0) {
    writer_->WriteVar(expr->table, NextChar::Space);
  }
  writer_->WriteOpenSpace("type");
  writer_->WriteVar(expr->decl.type_var, NextChar::Newline);
  writer_->WriteCloseNewline();
  return Result::Ok;
}